

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

void __thiscall NoiseSource::NoiseSource(NoiseSource *this,Time *time,Matrix *a)

{
  Matrix local_180;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  Matrix *local_20;
  Matrix *a_local;
  Time *time_local;
  NoiseSource *this_local;
  
  local_20 = a;
  a_local = (Matrix *)time;
  time_local = (Time *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Stochastic",&local_79);
  StochasticProcess::StochasticProcess(&this->super_StochasticProcess,time,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  RandN::RandN((RandN *)this);
  (this->super_StochasticProcess).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__NoiseSource_00190298;
  (this->super_StochasticProcess).super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__NoiseSource_00190320;
  (this->super_StochasticProcess).super_Physical._vptr_Physical =
       (_func_int **)&PTR__NoiseSource_00190368;
  Matrix::Matrix(&local_180,a);
  setMixingMatrix(this,&local_180);
  Matrix::~Matrix(&local_180);
  return;
}

Assistant:

NoiseSource::NoiseSource(Time *time, Matrix a )
	: StochasticProcess(time)
{
	setMixingMatrix(a);
}